

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O2

void __thiscall
Assimp::LWOImporter::LoadLWO2ShaderBlock(LWOImporter *this,SubChunkHeader *param_1,uint size)

{
  uint8_t **outFile;
  pointer pSVar1;
  uint8_t *puVar2;
  short *psVar3;
  int iVar4;
  Logger *this_00;
  SubChunkHeader SVar5;
  DeadlyImportError *this_01;
  ShaderList *this_02;
  uint8_t *puVar6;
  const_iterator __position;
  allocator<char> local_99;
  Shader shader;
  string local_50;
  
  pSVar1 = (this->mSurfaces->
           super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->mSurfaces->
      super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>)._M_impl.
      super__Vector_impl_data._M_start == pSVar1) {
    __assert_fail("!mSurfaces->empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/LWO/LWOMaterial.cpp"
                  ,0x2ab,
                  "void Assimp::LWOImporter::LoadLWO2ShaderBlock(IFF::SubChunkHeader *, unsigned int)"
                 );
  }
  puVar2 = this->mFileBuffer;
  LWO::Shader::Shader(&shader);
  GetS0(this,&shader.ordinal,size);
  if (shader.ordinal._M_string_length == 0) {
    this_00 = DefaultLogger::get();
    Logger::error(this_00,"LWO2: Ill-formed SURF.BLOK ordinal string");
    std::__cxx11::string::assign((char *)&shader);
  }
  outFile = &this->mFileBuffer;
  puVar6 = *outFile;
  while (puVar6 + 6 < puVar2 + size) {
    SVar5 = IFF::LoadSubChunk(outFile);
    psVar3 = (short *)*outFile;
    puVar6 = (uint8_t *)(((ulong)SVar5 >> 0x20 & 0xffff) + (long)psVar3);
    if (puVar2 + size < puVar6) {
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"LWO2: Invalid shader header chunk length",&local_99);
      DeadlyImportError::DeadlyImportError(this_01,&local_50);
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (SVar5.type == 0x46554e43) {
      GetS0(this,&shader.functionName,SVar5._4_4_ & 0xffff);
    }
    else if (SVar5.type == 0x454e4142) {
      shader.enabled = *psVar3 != 0;
      *outFile = (uint8_t *)(psVar3 + 1);
    }
    *outFile = puVar6;
  }
  this_02 = &pSVar1[-1].mShaders;
  __position._M_node = (_List_node_base *)this_02;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)this_02) {
      std::__cxx11::list<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>::push_back
                (this_02,&shader);
      goto LAB_0041f12c;
    }
    iVar4 = strcmp(shader.ordinal._M_dataplus._M_p,(char *)__position._M_node[1]._M_next);
  } while (-1 < iVar4);
  std::__cxx11::list<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>::insert
            (this_02,__position,&shader);
LAB_0041f12c:
  LWO::Shader::~Shader(&shader);
  return;
}

Assistant:

void LWOImporter::LoadLWO2ShaderBlock(LE_NCONST IFF::SubChunkHeader* /*head*/, unsigned int size )
{
    LE_NCONST uint8_t* const end = mFileBuffer + size;

    ai_assert(!mSurfaces->empty());
    LWO::Surface& surf = mSurfaces->back();
    LWO::Shader shader;

    // get the ordinal string
    GetS0( shader.ordinal, size);

    // we could crash later if this is an empty string ...
    if (!shader.ordinal.length())
    {
        ASSIMP_LOG_ERROR("LWO2: Ill-formed SURF.BLOK ordinal string");
        shader.ordinal = "\x00";
    }

    // read the header
    while (true)
    {
        if (mFileBuffer + 6 >= end)break;
        const IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
            throw DeadlyImportError("LWO2: Invalid shader header chunk length");

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
        case AI_LWO_ENAB:
            shader.enabled = GetU2() ? true : false;
            break;

        case AI_LWO_FUNC:
            GetS0( shader.functionName, head.length );
        }
        mFileBuffer = next;
    }

    // now attach the shader to the parent surface - sort by ordinal string
    for (ShaderList::iterator it = surf.mShaders.begin();it != surf.mShaders.end(); ++it)   {
        if (::strcmp(shader.ordinal.c_str(),(*it).ordinal.c_str()) < 0) {
            surf.mShaders.insert(it,shader);
            return;
        }
    }
    surf.mShaders.push_back(shader);
}